

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeCreateTable(Btree *p,Pgno *piTable,int flags)

{
  int *piVar1;
  BtShared *pBt;
  uint uVar2;
  uint uVar3;
  BtCursor *pBVar4;
  int iVar5;
  DbPage *pPg;
  uint nearby;
  MemPage *pMVar6;
  u8 eType;
  MemPage *pRoot;
  Pgno pgnoRoot;
  Pgno pgnoMove;
  MemPage *pPageMove;
  u8 local_5d;
  int local_5c;
  MemPage *local_58;
  uint local_50;
  Pgno local_4c;
  uint local_48;
  uint local_44;
  MemPage *local_40;
  Pgno *local_38;
  
  if ((p->sharable != '\0') && (p->wantToLock = p->wantToLock + 1, p->locked == '\0')) {
    btreeLockCarefully(p);
  }
  pBt = p->pBt;
  if (pBt->autoVacuum == '\0') {
    iVar5 = allocateBtreePage(pBt,&local_58,&local_50,1,'\0');
    pMVar6 = local_58;
    local_5c = iVar5;
    if (iVar5 != 0) goto LAB_0014209d;
LAB_00141fd6:
    zeroPage(pMVar6,(flags & 1U) * 3 + 10);
    if (pMVar6->pDbPage != (DbPage *)0x0) {
      sqlite3PagerUnrefNotNull(pMVar6->pDbPage);
    }
    *piTable = local_50;
    iVar5 = 0;
    goto LAB_0014209d;
  }
  for (pBVar4 = pBt->pCursor; pBVar4 != (BtCursor *)0x0; pBVar4 = pBVar4->pNext) {
    pBVar4->curFlags = pBVar4->curFlags & 0xfb;
  }
  local_38 = piTable;
  sqlite3BtreeGetMeta(p,4,&local_50);
  if (pBt->nPage < local_50) {
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x12af0,
                "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
    iVar5 = 0xb;
    goto LAB_0014209d;
  }
  do {
    uVar2 = local_50;
    nearby = uVar2 + 1;
    uVar3 = 0;
    if (1 < nearby) {
      iVar5 = (uVar2 - 1) - (uVar2 - 1) % (pBt->usableSize / 5 + 1);
      uVar3 = iVar5 + (uint)(iVar5 + 1U == (uint)sqlite3PendingByte / pBt->pageSize) + 2;
    }
    local_50 = nearby;
  } while ((nearby == uVar3) || (uVar2 == (uint)sqlite3PendingByte / pBt->pageSize));
  local_5c = allocateBtreePage(pBt,&local_40,&local_44,nearby,'\x01');
  iVar5 = local_5c;
  if (local_5c != 0) goto LAB_0014209d;
  if (local_44 == nearby) {
    local_58 = local_40;
    pMVar6 = local_40;
LAB_001420d5:
    ptrmapPut(pBt,nearby,'\x01',0,&local_5c);
    if ((local_5c == 0) &&
       (local_5c = sqlite3BtreeUpdateMeta(p,4,nearby), piTable = local_38, local_5c == 0))
    goto LAB_00141fd6;
    iVar5 = local_5c;
    if (pMVar6 == (MemPage *)0x0) goto LAB_0014209d;
    pPg = pMVar6->pDbPage;
  }
  else {
    local_5d = '\0';
    local_4c = 0;
    if (pBt->pCursor == (BtCursor *)0x0) {
      iVar5 = 0;
    }
    else {
      iVar5 = saveCursorsOnList(pBt->pCursor,0,(BtCursor *)0x0);
    }
    if (local_40 != (MemPage *)0x0) {
      sqlite3PagerUnrefNotNull(local_40->pDbPage);
    }
    if ((iVar5 != 0) || (iVar5 = btreeGetPage(pBt,nearby,&local_58,0), iVar5 != 0))
    goto LAB_0014209d;
    local_48 = local_44;
    iVar5 = ptrmapGet(pBt,nearby,&local_5d,&local_4c);
    pMVar6 = local_58;
    if ((byte)(local_5d - 1) < 2) {
      iVar5 = 0xb;
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x12b20,
                  "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
LAB_001421e6:
      pMVar6 = local_58;
      if (local_58 == (MemPage *)0x0) goto LAB_0014209d;
    }
    else {
      if (iVar5 != 0) goto LAB_001421e6;
      iVar5 = relocatePage(pBt,local_58,local_5d,local_4c,local_48,0);
      if (pMVar6 != (MemPage *)0x0) {
        sqlite3PagerUnrefNotNull(pMVar6->pDbPage);
      }
      if ((iVar5 != 0) ||
         (iVar5 = btreeGetPage(pBt,nearby,&local_58,0), pMVar6 = local_58, iVar5 != 0))
      goto LAB_0014209d;
      iVar5 = sqlite3PagerWrite(local_58->pDbPage);
      local_5c = iVar5;
      if (iVar5 == 0) goto LAB_001420d5;
    }
    pPg = pMVar6->pDbPage;
  }
  sqlite3PagerUnrefNotNull(pPg);
LAB_0014209d:
  if (p->sharable != '\0') {
    piVar1 = &p->wantToLock;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      unlockBtreeMutex(p);
    }
  }
  return iVar5;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCreateTable(Btree *p, Pgno *piTable, int flags){
  int rc;
  sqlite3BtreeEnter(p);
  rc = btreeCreateTable(p, piTable, flags);
  sqlite3BtreeLeave(p);
  return rc;
}